

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_finalize(wally_psbt *psbt)

{
  wally_psbt_input *input;
  wally_psbt_input *pwVar1;
  wally_tx_output *pwVar2;
  wally_tx *pwVar3;
  wally_map_item *pwVar4;
  size_t sVar5;
  wally_map *pwVar6;
  _Bool _Var7;
  int iVar8;
  ulong uVar9;
  uchar *puVar10;
  uchar *bytes;
  size_t in_RSI;
  size_t sVar11;
  uchar *puVar12;
  ulong uVar13;
  size_t local_4b0;
  size_t opcode_size;
  size_t threshold;
  size_t n_pubkeys;
  uchar *local_478;
  wally_map *local_470;
  wally_tx_witness_stack **local_468;
  uchar *local_460;
  char local_458;
  undefined7 uStack_457;
  size_t type;
  size_t sig_index;
  size_t found_pubkey_len;
  uint32_t sighashes [15];
  uchar script [140];
  
  iVar8 = -2;
  if (((psbt != (wally_psbt *)0x0) && (iVar8 = -2, psbt->tx != (wally_tx *)0x0)) &&
     (sVar11 = psbt->tx->num_inputs, sVar11 == psbt->num_inputs)) {
    if (sVar11 != 0) {
      uVar13 = 0;
      do {
        pwVar1 = psbt->inputs;
        if ((pwVar1[uVar13].final_scriptsig == (uchar *)0x0) &&
           (input = pwVar1 + uVar13, input->final_witness == (wally_tx_witness_stack *)0x0)) {
          uVar9 = (ulong)psbt->tx->inputs[uVar13].index;
          pwVar2 = input->witness_utxo;
          if ((pwVar2 == (wally_tx_output *)0x0) || (pwVar2->script_len == 0)) {
            pwVar3 = input->utxo;
            if ((pwVar3 == (wally_tx *)0x0) || (pwVar3->num_outputs <= uVar9)) {
              bytes = (uchar *)0x0;
            }
            else {
              bytes = pwVar3->outputs[uVar9].script;
              in_RSI = pwVar3->outputs[uVar9].script_len;
            }
            local_458 = '\0';
            uStack_457 = 0;
          }
          else {
            bytes = pwVar2->script;
            uStack_457 = (undefined7)((ulong)pwVar2 >> 8);
            local_458 = '\x01';
            in_RSI = pwVar2->script_len;
          }
          local_460 = input->redeem_script;
          if (local_460 != (uchar *)0x0) {
            in_RSI = input->redeem_script_len;
            bytes = local_460;
          }
          if (input->witness_script == (uchar *)0x0) {
            if (bytes == (uchar *)0x0) goto LAB_004a424c;
          }
          else {
            in_RSI = input->witness_script_len;
            local_458 = '\x01';
            bytes = input->witness_script;
          }
          iVar8 = wally_scriptpubkey_get_type(bytes,in_RSI,&type);
          if (iVar8 == 0) {
            if (type == 0x20) {
              local_468 = &input->final_witness;
              _Var7 = script_is_op_n(*bytes,false,&threshold);
              if ((_Var7) && (threshold <= (input->signatures).num_items)) {
                puVar10 = bytes + in_RSI;
                _Var7 = script_is_op_n(puVar10[-2],false,&n_pubkeys);
                if (n_pubkeys < 0x10 && _Var7) {
                  if (n_pubkeys == 0) {
                    local_4b0 = 0;
                  }
                  else {
                    puVar12 = bytes + 1;
                    local_4b0 = 0;
                    if (puVar12 < puVar10) {
                      local_470 = &input->signatures;
                      uVar9 = 1;
                      local_4b0 = 0;
                      local_478 = puVar10;
                      do {
                        sVar11 = (long)local_478 - (long)puVar12;
                        iVar8 = script_get_push_size_from_bytes(puVar12,sVar11,&found_pubkey_len);
                        if ((iVar8 != 0) ||
                           (iVar8 = script_get_push_opcode_size_from_bytes
                                              (puVar12,sVar11,&opcode_size),
                           sVar11 = found_pubkey_len, pwVar6 = local_470, iVar8 != 0))
                        goto LAB_004a4629;
                        puVar12 = puVar12 + opcode_size;
                        iVar8 = wally_map_find(local_470,puVar12,found_pubkey_len,&sig_index);
                        if (sig_index != 0 && iVar8 == 0) {
                          puVar10 = pwVar6->items[sig_index - 1].value;
                          sVar5 = pwVar6->items[sig_index - 1].value_len;
                          sighashes[local_4b0] = (uint)puVar10[sVar5 - 1];
                          iVar8 = wally_ec_sig_from_der
                                            (puVar10,sVar5 - 1,script + local_4b0 * 0x40,0x40);
                          if ((iVar8 == 0) && (local_4b0 = local_4b0 + 1, local_4b0 == threshold))
                          break;
                        }
                        if (n_pubkeys <= uVar9) break;
                        puVar12 = puVar12 + sVar11;
                        uVar9 = uVar9 + 1;
                      } while (puVar12 < local_478);
                    }
                  }
                  if (local_4b0 == threshold) {
                    if (local_458 == '\0') {
                      sVar11 = local_4b0 * 0x4a + in_RSI;
                      puVar10 = (uchar *)wally_malloc(sVar11);
                      if ((puVar10 != (uchar *)0x0) &&
                         (iVar8 = wally_scriptsig_multisig_from_bytes
                                            (bytes,in_RSI,script,local_4b0 << 6,sighashes,local_4b0,
                                             0,puVar10,sVar11,&opcode_size), iVar8 == 0)) {
                        input->final_scriptsig = puVar10;
                        input->final_scriptsig_len = opcode_size;
                        goto LAB_004a465a;
                      }
                      wally_free(puVar10);
                    }
                    else {
                      iVar8 = wally_witness_multisig_from_bytes
                                        (bytes,in_RSI,script,local_4b0 << 6,sighashes,local_4b0,0,
                                         local_468);
                      if ((iVar8 == 0) &&
                         ((local_460 == (uchar *)0x0 ||
                          (_Var7 = finalize_p2sh_wrapped(input), _Var7)))) {
LAB_004a465a:
                        wally_clear_2(script,0x3c0,sighashes,0x3c);
                        goto LAB_004a435b;
                      }
                    }
                  }
                }
              }
LAB_004a4629:
              wally_clear_2(script,0x3c0,sighashes,0x3c);
            }
            else if (type == 8) {
              if ((input->signatures).num_items == 1) {
                pwVar4 = (input->signatures).items;
                iVar8 = wally_witness_p2wpkh_from_der
                                  (pwVar4->key,pwVar4->key_len,pwVar4->value,pwVar4->value_len,
                                   &input->final_witness);
                if ((iVar8 == 0) &&
                   ((input->redeem_script == (uchar *)0x0 ||
                    (_Var7 = finalize_p2sh_wrapped(input), _Var7)))) goto LAB_004a435b;
              }
            }
            else if ((type == 2) && ((input->signatures).num_items == 1)) {
              pwVar4 = (input->signatures).items;
              iVar8 = wally_scriptsig_p2pkh_from_der
                                (pwVar4->key,pwVar4->key_len,pwVar4->value,pwVar4->value_len,script,
                                 0x8c,(size_t *)sighashes);
              if ((iVar8 == 0) &&
                 (_Var7 = clone_bytes(&pwVar1[uVar13].final_scriptsig,script,sighashes._0_8_), _Var7
                 )) {
                input->final_scriptsig_len = sighashes._0_8_;
LAB_004a435b:
                clear_and_free(input->redeem_script,input->redeem_script_len);
                input->redeem_script = (uchar *)0x0;
                input->redeem_script_len = 0;
                clear_and_free(input->witness_script,input->witness_script_len);
                input->witness_script = (uchar *)0x0;
                input->witness_script_len = 0;
                wally_map_clear(&input->keypaths);
                wally_map_clear(&input->signatures);
                input->sighash = 0;
              }
            }
          }
        }
LAB_004a424c:
        uVar13 = uVar13 + 1;
      } while (uVar13 < psbt->num_inputs);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int wally_psbt_finalize(struct wally_psbt *psbt)
{
    size_t i;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        return WALLY_EINVAL;

    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        const uint32_t utxo_index = psbt->tx->inputs[i].index;

        /* Script for this input. originally set to the input's scriptPubKey, but in the case of a p2sh/p2wsh
         * input, it will be eventually be set to the unhashed script, if known */
        unsigned char *out_script = NULL;
        size_t out_script_len, type;
        bool is_witness = false, is_p2sh = false;

        if (input->final_scriptsig || input->final_witness)
            continue; /* Already finalized */

        /* Note that if we patch libwally to supply the non-witness utxo tx field (tx) for
        * witness inputs also, we'll need a different way to signal p2sh-p2wpkh scripts */
        if (input->witness_utxo && input->witness_utxo->script_len > 0) {
            out_script = input->witness_utxo->script;
            out_script_len = input->witness_utxo->script_len;
            is_witness = true;
        } else if (input->utxo && utxo_index < input->utxo->num_outputs) {
            struct wally_tx_output *out = &input->utxo->outputs[utxo_index];
            out_script = out->script;
            out_script_len = out->script_len;
        }
        if (input->redeem_script) {
            out_script = input->redeem_script;
            out_script_len = input->redeem_script_len;
            is_p2sh = true;
        }
        if (input->witness_script) {
            out_script = input->witness_script;
            out_script_len = input->witness_script_len;
            is_witness = true;
        }

        if (!out_script)
            continue; /* We need an outscript to do anything */

        if (wally_scriptpubkey_get_type(out_script, out_script_len, &type) != WALLY_OK)
            continue; /* Can't identify the type, skip */

        switch(type) {
        case WALLY_SCRIPT_TYPE_P2PKH:
            if (!finalize_p2pkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_P2WPKH:
            if (!finalize_p2wpkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_MULTISIG:
            if (!finalize_multisig(input, out_script, out_script_len, is_witness, is_p2sh))
                continue;
            break;
        default:
            continue; /* Can't finalize this input, skip */
        }

        /* Clear non-final things */
        clear_and_free(input->redeem_script, input->redeem_script_len);
        input->redeem_script_len = 0;
        input->redeem_script = NULL;
        clear_and_free(input->witness_script, input->witness_script_len);
        input->witness_script_len = 0;
        input->witness_script = NULL;
        wally_map_clear(&input->keypaths);
        wally_map_clear(&input->signatures);
        input->sighash = 0;
    }
    return WALLY_OK;
}